

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O3

int kvtree_read_scatter_map
              (char *prefix,int depth,int *ptr_valid,char **ptr_file,unsigned_long *ptr_offset,
              MPI_Comm comm)

{
  int iVar1;
  char *file;
  unsigned_long pos;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  kvtree *hash_00;
  ssize_t sVar6;
  kvtree *pkVar7;
  kvtree *recv_00;
  kvtree *hash2;
  kvtree_elem *elem;
  uint uVar8;
  int level_id;
  int all_valid;
  unsigned_long newoffset;
  kvtree *recv;
  kvtree *send;
  kvtree *hash;
  char mappath [1024];
  int local_494;
  char *local_490;
  undefined8 local_488;
  int local_47c;
  char *local_478;
  int *local_470;
  char **local_468;
  unsigned_long *local_460;
  unsigned_long local_458;
  kvtree *local_450;
  kvtree *local_448;
  kvtree *local_440;
  uint local_438 [258];
  
  iVar1 = *ptr_valid;
  file = *ptr_file;
  pos = *ptr_offset;
  local_47c = depth;
  local_478 = prefix;
  local_470 = ptr_valid;
  local_468 = ptr_file;
  local_460 = ptr_offset;
  hash_00 = kvtree_new();
  uVar8 = 0;
  local_440 = hash_00;
  if (iVar1 != 0) {
    iVar3 = kvtree_open(file,0);
    if (iVar3 < 0) {
      kvtree_err("Failed to open file %s @ %s:%d",file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                 ,0x19f);
      uVar8 = 1;
    }
    else {
      kvtree_lseek(file,iVar3,pos,0);
      sVar6 = kvtree_read_fd(file,iVar3,hash_00);
      if (sVar6 < 0) {
        kvtree_err("Failed to read from %s @ %s:%d",file,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                   ,0x196);
      }
      uVar8 = (uint)(sVar6 < 0);
      kvtree_close(file,iVar3);
    }
  }
  local_438[0] = (uint)(uVar8 == 0);
  MPI_Allreduce(local_438,&local_488,1,&ompi_mpi_int,&ompi_mpi_op_land,comm);
  uVar5 = 1;
  if ((int)local_488 != 0) {
    pkVar7 = kvtree_new();
    local_448 = pkVar7;
    recv_00 = kvtree_new();
    local_450 = recv_00;
    if (iVar1 != 0) {
      hash2 = kvtree_get(hash_00,"RANK");
      kvtree_merge(pkVar7,hash2);
    }
    iVar3 = 0;
    kvtree_exchange_direction(pkVar7,recv_00,comm,KVTREE_EXCHANGE_RIGHT);
    local_458 = 0;
    elem = kvtree_elem_first(recv_00);
    if (elem == (kvtree_elem *)0x0) {
      local_490 = (char *)0x0;
    }
    else {
      pkVar7 = kvtree_elem_hash(elem);
      iVar3 = kvtree_util_get_str(pkVar7,"FILE",(char **)&local_488);
      if (iVar3 == 0) {
        snprintf((char *)local_438,0x400,"%s%s",local_478,CONCAT44(local_488._4_4_,(int)local_488));
        local_490 = strdup((char *)local_438);
      }
      else {
        local_490 = (char *)0x0;
        uVar8 = 1;
      }
      iVar3 = 1;
      iVar4 = kvtree_util_get_bytecount(pkVar7,"OFFSET",&local_458);
      if (iVar4 != 0) {
        uVar8 = 1;
      }
    }
    kvtree_delete(&local_450);
    kvtree_delete(&local_448);
    local_494 = -1;
    if (iVar1 != 0) {
      iVar4 = kvtree_util_get_int(hash_00,"LEVEL",&local_494);
      if (iVar4 != 0) {
        uVar8 = 1;
      }
    }
    MPI_Bcast(&local_494,1,&ompi_mpi_int,0,comm);
    local_438[0] = (uint)(uVar8 == 0);
    MPI_Allreduce(local_438,&local_488,1,&ompi_mpi_int,&ompi_mpi_op_land,comm);
    ppcVar2 = local_468;
    uVar5 = 1;
    if ((int)local_488 != 0) {
      if (iVar1 != 0) {
        kvtree_free(local_468);
      }
      *local_470 = iVar3;
      *ppcVar2 = local_490;
      *local_460 = local_458;
      uVar5 = uVar8;
      if (1 < local_494) {
        uVar5 = kvtree_read_scatter_map(local_478,local_47c + 1,local_470,local_468,local_460,comm);
      }
    }
  }
  kvtree_delete(&local_440);
  return uVar5;
}

Assistant:

static int kvtree_read_scatter_map(
  const char*     prefix,
  int             depth,
  int*            ptr_valid,
  char**          ptr_file,
  unsigned long*  ptr_offset,
  MPI_Comm        comm)
{
  int rc = KVTREE_SUCCESS;

  /* get local variables so we don't have to deference everything */
  int valid            = *ptr_valid;
  char* file           = *ptr_file;
  unsigned long offset = *ptr_offset;

  /* create a hash to hold section of file */
  kvtree* hash = kvtree_new();

  /* if we can read from file do it */
  if (valid) {
    /* open file if we haven't already */
    int fd = kvtree_open(file, O_RDONLY);
    if (fd >= 0) {
      /* read our segment from the file */
      kvtree_lseek(file, fd, offset, SEEK_SET);
      ssize_t read_rc = kvtree_read_fd(file, fd, hash);
      if (read_rc < 0) {
        kvtree_err("Failed to read from %s @ %s:%d",
          file, __FILE__, __LINE__
        );
        rc = KVTREE_FAILURE;
      }

      /* close the file */
      kvtree_close(file, fd);
    } else {
      kvtree_err("Failed to open file %s @ %s:%d",
        file, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* check for read errors */
  if (! kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    rc = KVTREE_FAILURE;
    goto cleanup;
  }

  /* create hashes to exchange data */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* copy rank data into send hash */
  if (valid) {
    kvtree* rank_hash = kvtree_get(hash, "RANK");
    kvtree_merge(send, rank_hash);
  }

  /* exchange hashes */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_RIGHT);

  /* see if anyone sent us anything */
  int newvalid = 0;
  char* newfile = NULL;
  unsigned long newoffset = 0;
  kvtree_elem* elem = kvtree_elem_first(recv);
  if (elem != NULL) {
    /* got something, so now we'll read in the next step */
    newvalid = 1;

    /* get file name we should read */
    kvtree* elem_hash = kvtree_elem_hash(elem);
    char* value;
    if (kvtree_util_get_str(elem_hash, "FILE", &value) == KVTREE_SUCCESS)
    {
      /* return string of full path to file to caller */
      char mappath[1024];
      snprintf(mappath, sizeof(mappath), "%s%s", prefix, value);
      newfile = strdup(mappath);
    } else {
      rc = KVTREE_FAILURE;
    }

    /* get offset we should start reading from */
    if (kvtree_util_get_bytecount(elem_hash, "OFFSET", &newoffset) != KVTREE_SUCCESS)
    {
      rc = KVTREE_FAILURE;
    }
  }

  /* free the send and receive hashes */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* get level id, and broadcast it from rank 0,
   * which we assume to be a reader in all steps */
  int level_id = -1;
  if (valid) {
    if (kvtree_util_get_int(hash, "LEVEL", &level_id) != KVTREE_SUCCESS)
    {
      rc = KVTREE_FAILURE;
    }
  }
  MPI_Bcast(&level_id, 1, MPI_INT, 0, comm);

  /* check for read errors */
  if (! kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    rc = KVTREE_FAILURE;
    goto cleanup;
  }

  /* set parameters for output or next iteration,
   * we already took care of updating ptr_fd earlier */
  if (valid) {
    kvtree_free(ptr_file);
  }
  *ptr_valid  = newvalid;
  *ptr_file   = newfile;
  *ptr_offset = newoffset;

  /* recurse if we still have levels to read */
  if (level_id > 1) {
    rc = kvtree_read_scatter_map(prefix, depth+1, ptr_valid, ptr_file, ptr_offset, comm);
  }

cleanup:
  /* free the hash */
  kvtree_delete(&hash);

  return rc;
}